

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlElementType xVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  xmlDocPtr pxVar3;
  int iVar4;
  int iVar5;
  xmlRelaxNGValidStatePtr pxVar6;
  xmlNodePtr pxVar7;
  xmlRelaxNGStatesPtr pxVar8;
  xmlGenericErrorFunc *pp_Var9;
  xmlRelaxNGValidCtxtPtr pxVar10;
  xmlDocPtr pxVar11;
  long lVar12;
  xmlGenericErrorFunc p_Var13;
  bool bVar14;
  xmlValidCtxt local_a0;
  
  if (doc == (xmlDocPtr)0x0 || ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return -1;
  }
  ctxt->doc = doc;
  iVar4 = -1;
  if (ctxt->schema != (xmlRelaxNGPtr)0x0) {
    ctxt->errNo = 0;
    pxVar2 = ctxt->schema->topgrammar;
    if (pxVar2 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOGRAMMAR,(xmlChar *)0x0,(xmlChar *)0x0,0);
    }
    else {
      pxVar6 = xmlRelaxNGNewValidState(ctxt,(xmlNodePtr)0x0);
      ctxt->state = pxVar6;
      iVar4 = xmlRelaxNGValidateDefinition(ctxt,pxVar2->start);
      if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) || (pxVar6->seq == (xmlNodePtr)0x0)) {
        pxVar8 = ctxt->states;
        if (pxVar8 != (xmlRelaxNGStatesPtr)0x0) {
          if (pxVar8->nbState < 1) {
            bVar14 = true;
          }
          else {
            iVar5 = -1;
            lVar12 = 0;
            do {
              pxVar6 = pxVar8->tabState[lVar12];
              pxVar7 = xmlRelaxNGSkipIgnored(ctxt,pxVar6->seq);
              if (pxVar7 == (xmlNodePtr)0x0) {
                iVar5 = 0;
              }
              xmlRelaxNGFreeValidState(ctxt,pxVar6);
              lVar12 = lVar12 + 1;
              pxVar8 = ctxt->states;
            } while (lVar12 < pxVar8->nbState);
            bVar14 = iVar5 == -1;
          }
          if (bVar14) goto LAB_001816c7;
        }
      }
      else {
        pxVar7 = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
        if (pxVar7 != (xmlNodePtr)0x0) {
LAB_001816c7:
          if (iVar4 != -1) {
            xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_EXTRADATA,(xmlChar *)0x0,(xmlChar *)0x0,0);
            iVar4 = -1;
          }
        }
      }
      if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
        xmlRelaxNGFreeValidState(ctxt,ctxt->state);
        ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
      }
      if (iVar4 == 0) {
        if (ctxt->idref == 1) goto LAB_00181724;
LAB_001817b9:
        iVar4 = -(uint)(ctxt->errNo != 0);
      }
      else {
        xmlRelaxNGDumpValidError(ctxt);
        if (ctxt->idref == 1) {
LAB_00181724:
          local_a0.doc = (xmlDocPtr)0x0;
          local_a0.vstateTab = (xmlValidState *)0x0;
          local_a0.am = (xmlAutomataPtr)0x0;
          local_a0.vstate = (xmlValidState *)0x0;
          local_a0.vstateNr = 0;
          local_a0.vstateMax = 0;
          local_a0.nodeTab = (xmlNodePtr *)0x0;
          local_a0.flags = 0;
          local_a0._52_4_ = 0;
          local_a0.node = (xmlNodePtr)0x0;
          local_a0.nodeNr = 0;
          local_a0.nodeMax = 0;
          local_a0.error = (xmlValidityErrorFunc)0x0;
          local_a0.warning = (xmlValidityWarningFunc)0x0;
          local_a0.state = (xmlAutomataStatePtr)0x0;
          local_a0.valid = 1;
          local_a0._68_4_ = 0;
          if (ctxt->error == (xmlGenericErrorFunc)0x0) {
            pp_Var9 = __xmlGenericError();
            local_a0.error = *pp_Var9;
            pp_Var9 = __xmlGenericError();
            p_Var13 = *pp_Var9;
            pxVar10 = (xmlRelaxNGValidCtxtPtr)__xmlGenericErrorContext();
          }
          else {
            p_Var13 = ctxt->warning;
            pxVar10 = ctxt;
            local_a0.error = ctxt->error;
          }
          bVar14 = iVar4 == 0;
          local_a0.userData = pxVar10->userData;
          local_a0.warning = p_Var13;
          iVar5 = xmlValidateDocumentFinal(&local_a0,doc);
          if (iVar5 != 1) {
            iVar4 = -1;
          }
          if (iVar5 == 1 && bVar14) goto LAB_001817b9;
        }
      }
    }
  }
  xVar1 = doc->type;
  if ((xVar1 != XML_HTML_DOCUMENT_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
    if (xVar1 != XML_ELEMENT_NODE) goto LAB_00181817;
    doc->version = (xmlChar *)0x0;
  }
  pxVar3 = (xmlDocPtr)doc->children;
  if ((xmlDocPtr)doc->children != (xmlDocPtr)0x0) {
LAB_001817e6:
    pxVar11 = pxVar3;
    if (pxVar11->type == XML_ELEMENT_NODE) goto code_r0x001817ef;
    goto LAB_00181800;
  }
LAB_00181817:
  iVar5 = 1;
  if (iVar4 != -1) {
    iVar5 = iVar4;
  }
  return iVar5;
code_r0x001817ef:
  pxVar11->version = (xmlChar *)0x0;
  pxVar3 = (xmlDocPtr)pxVar11->children;
  if ((xmlDocPtr)pxVar11->children == (xmlDocPtr)0x0) {
LAB_00181800:
    while (pxVar3 = (xmlDocPtr)pxVar11->next, (xmlDocPtr)pxVar11->next == (xmlDocPtr)0x0) {
      pxVar11 = (xmlDocPtr)pxVar11->parent;
      if ((pxVar11 == (xmlDocPtr)0x0) || (pxVar11 == doc)) goto LAB_00181817;
    }
  }
  goto LAB_001817e6;
}

Assistant:

int
xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt, xmlDocPtr doc)
{
    int ret;

    if ((ctxt == NULL) || (doc == NULL))
        return (-1);

    ctxt->doc = doc;

    ret = xmlRelaxNGValidateDocument(ctxt, doc);
    /*
     * Remove all left PSVI
     */
    xmlRelaxNGCleanPSVI((xmlNodePtr) doc);

    /*
     * TODO: build error codes
     */
    if (ret == -1)
        return (1);
    return (ret);
}